

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAlignedObjectArray.h
# Opt level: O3

void __thiscall
cbtAlignedObjectArray<cbtElement>::quickSortInternal<cbtUnionFindElementSortPredicate>
          (cbtAlignedObjectArray<cbtElement> *this,cbtUnionFindElementSortPredicate *CompareFunc,
          int lo,int hi)

{
  int iVar1;
  cbtElement *pcVar2;
  cbtElement cVar3;
  long lVar4;
  int iVar5;
  int hi_00;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  
  do {
    iVar1 = this->m_data[(lo + hi) / 2].m_id;
    iVar6 = lo;
    hi_00 = hi;
    do {
      pcVar2 = this->m_data;
      lVar7 = (long)iVar6 + -1;
      iVar5 = iVar6;
      do {
        iVar6 = iVar5;
        lVar8 = lVar7 + 1;
        lVar4 = lVar7 + 1;
        lVar7 = lVar8;
        iVar5 = iVar6 + 1;
      } while (pcVar2[lVar4].m_id < iVar1);
      lVar7 = (long)hi_00 + 1;
      iVar5 = hi_00;
      do {
        hi_00 = iVar5;
        lVar9 = lVar7 + -1;
        lVar4 = lVar7 + -1;
        lVar7 = lVar9;
        iVar5 = hi_00 + -1;
      } while (iVar1 < pcVar2[lVar4].m_id);
      if (lVar8 <= lVar9) {
        cVar3 = pcVar2[lVar8];
        pcVar2[lVar8] = pcVar2[lVar9];
        this->m_data[lVar9] = cVar3;
        iVar6 = iVar6 + 1;
        hi_00 = hi_00 + -1;
      }
    } while (iVar6 <= hi_00);
    if (lo < hi_00) {
      quickSortInternal<cbtUnionFindElementSortPredicate>(this,CompareFunc,lo,hi_00);
    }
    lo = iVar6;
  } while (iVar6 < hi);
  return;
}

Assistant:

void quickSortInternal(const L& CompareFunc, int lo, int hi)
	{
		//  lo is the lower index, hi is the upper index
		//  of the region of array a that is to be sorted
		int i = lo, j = hi;
		T x = m_data[(lo + hi) / 2];

		//  partition
		do
		{
			while (CompareFunc(m_data[i], x))
				i++;
			while (CompareFunc(x, m_data[j]))
				j--;
			if (i <= j)
			{
				swap(i, j);
				i++;
				j--;
			}
		} while (i <= j);

		//  recursion
		if (lo < j)
			quickSortInternal(CompareFunc, lo, j);
		if (i < hi)
			quickSortInternal(CompareFunc, i, hi);
	}